

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void I422ToYUY2Row_C(uint8_t *src_y,uint8_t *src_u,uint8_t *src_v,uint8_t *dst_frame,int width)

{
  long lVar1;
  int iVar2;
  
  lVar1 = 0;
  for (iVar2 = 0; iVar2 < width + -1; iVar2 = iVar2 + 2) {
    dst_frame[lVar1 * 4] = src_y[lVar1 * 2];
    dst_frame[lVar1 * 4 + 1] = src_u[lVar1];
    dst_frame[lVar1 * 4 + 2] = src_y[lVar1 * 2 + 1];
    dst_frame[lVar1 * 4 + 3] = src_v[lVar1];
    lVar1 = lVar1 + 1;
  }
  if ((width & 1U) != 0) {
    dst_frame[lVar1 * 4] = src_y[lVar1 * 2];
    dst_frame[lVar1 * 4 + 1] = src_u[lVar1];
    dst_frame[lVar1 * 4 + 2] = '\0';
    dst_frame[lVar1 * 4 + 3] = src_v[lVar1];
  }
  return;
}

Assistant:

void I422ToYUY2Row_C(const uint8_t* src_y,
                     const uint8_t* src_u,
                     const uint8_t* src_v,
                     uint8_t* dst_frame,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_frame[0] = src_y[0];
    dst_frame[1] = src_u[0];
    dst_frame[2] = src_y[1];
    dst_frame[3] = src_v[0];
    dst_frame += 4;
    src_y += 2;
    src_u += 1;
    src_v += 1;
  }
  if (width & 1) {
    dst_frame[0] = src_y[0];
    dst_frame[1] = src_u[0];
    dst_frame[2] = 0;
    dst_frame[3] = src_v[0];
  }
}